

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

mz_bool (anonymous_namespace)::miniz::mz_zip_writer_add_put_buf_callback
                  (void *pBuf,int len,void *pUser)

{
  int iVar1;
  long lVar2;
  
  lVar2 = (long)len;
  iVar1 = (**(code **)(*pUser + 0x48))
                    (*(undefined8 *)(*pUser + 0x50),*(undefined8 *)((long)pUser + 8),pBuf,lVar2);
  if (iVar1 == len) {
    *(long *)((long)pUser + 8) = *(long *)((long)pUser + 8) + lVar2;
    *(long *)((long)pUser + 0x10) = *(long *)((long)pUser + 0x10) + lVar2;
  }
  return (uint)(iVar1 == len);
}

Assistant:

static mz_bool mz_zip_writer_add_put_buf_callback(const void *pBuf, int len,
                                                  void *pUser) {
  mz_zip_writer_add_state *pState = (mz_zip_writer_add_state *)pUser;
  if ((int)pState->m_pZip->m_pWrite(pState->m_pZip->m_pIO_opaque,
                                    pState->m_cur_archive_file_ofs, pBuf,
                                    len) != len)
    return MZ_FALSE;
  pState->m_cur_archive_file_ofs += len;
  pState->m_comp_size += len;
  return MZ_TRUE;
}